

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

void insert_to_bucket(hashtable_t *hashtable,bucket_t *bucket,list_t *list)

{
  hashtable_list *phVar1;
  hashtable_list *phVar2;
  
  phVar1 = bucket->first;
  phVar2 = &hashtable->list;
  if ((phVar1 == phVar2) && (phVar1 == bucket->last)) {
    list->next = phVar2;
    list->prev = phVar2->prev;
    phVar2->prev->next = list;
    phVar2->prev = list;
    phVar1 = (hashtable_list *)&bucket->last;
  }
  else {
    list->next = phVar1;
    list->prev = phVar1->prev;
    phVar1->prev->next = list;
  }
  phVar1->prev = list;
  bucket->first = list;
  return;
}

Assistant:

static void insert_to_bucket(hashtable_t *hashtable, bucket_t *bucket, list_t *list) {
    if (bucket_is_empty(hashtable, bucket)) {
        list_insert(&hashtable->list, list);
        bucket->first = bucket->last = list;
    } else {
        list_insert(bucket->first, list);
        bucket->first = list;
    }
}